

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall asl::Array<asl::InetAddress>::free(Array<asl::InetAddress> *this,void *__ptr)

{
  InetAddress *p;
  Data *pDVar1;
  Array<asl::InetAddress> *this_local;
  
  p = this->_a;
  pDVar1 = d(this);
  asl_destroy<asl::InetAddress>(p,pDVar1->n);
  ::free(this->_a + -1);
  this->_a = (InetAddress *)0x0;
  return;
}

Assistant:

void Array<T>::free()
{
	asl_destroy(_a, d().n);
	ASL_RC_FREE();
	::free( (char*)_a - sizeof(Data) );
	_a=0;
}